

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O1

void __thiscall skiwi::anon_unknown_23::minmax_test::test(minmax_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 uVar2;
  int in_R8D;
  int iVar3;
  string res_52;
  string res_51;
  string res_50;
  string res_49;
  string res_48;
  string res_47;
  string res_46;
  string res_45;
  string res_44;
  string res_43;
  string res_42;
  string res_41;
  string res_40;
  string res_39;
  string res_38;
  string res_37;
  string res_36;
  string res_35;
  string res_34;
  string res_33;
  string res_32;
  string res_31;
  string res_30;
  string res_29;
  string res_28;
  string res_27;
  string res_26;
  string res_25;
  string res_24;
  string res_23;
  string res_22;
  string res_21;
  string res_20;
  string res_19;
  string res_18;
  string res_17;
  string res_16;
  string res_15;
  string res_14;
  string res_13;
  string res_12;
  string res_11;
  string res_10;
  string res_9;
  string res_8;
  string res_7;
  string res_6;
  string res_5;
  string res_4;
  string res_3;
  string res_2;
  string res_1;
  string res;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  string local_1278;
  string local_1258;
  string local_1238;
  string local_1218;
  string local_11f8;
  string local_11d8;
  string local_11b8;
  string local_1198;
  string local_1178;
  string local_1158;
  string local_1138;
  string local_1118;
  string local_10f8;
  string local_10d8;
  string local_10b8;
  string local_1098;
  string local_1078;
  string local_1058;
  string local_1038;
  string local_1018;
  string local_ff8;
  string local_fd8;
  string local_fb8;
  string local_f98;
  string local_f78;
  string local_f58;
  string local_f38;
  string local_f18;
  string local_ef8;
  string local_ed8;
  string local_eb8;
  string local_e98;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  compile_fixture::build_libs(&this->super_compile_fixture);
  paVar1 = &local_12f8.field_2;
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1)","");
  compile_fixture::run(&local_38,&this->super_compile_fixture,&local_12f8,true,in_R8D);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 2)","");
  compile_fixture::run(&local_58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1.5)","");
  compile_fixture::run(&local_78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 2.2)","");
  compile_fixture::run(&local_98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2.2",&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1.0 2.0)","");
  compile_fixture::run(&local_b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xe9f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)","");
  compile_fixture::run(&local_d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("7.2",&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1 2.0)","");
  compile_fixture::run(&local_f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1.0 2)","");
  compile_fixture::run(&local_118,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1 2)","");
  compile_fixture::run(&local_138,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1 2 7 -3 -11 6 3)","")
  ;
  compile_fixture::run(&local_158,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1.0 2.0)","");
  compile_fixture::run(&local_178,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)","");
  compile_fixture::run(&local_198,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1 2.0)","");
  compile_fixture::run(&local_1b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1.0 2)","");
  compile_fixture::run(&local_1d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xea9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1 2)","");
  compile_fixture::run(&local_1f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_1f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeaa,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1 2 7 -3 -11 6 3)","")
  ;
  compile_fixture::run(&local_218,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeab,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(arithmetic-shift 1 10)","");
  compile_fixture::run(&local_238,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1024",&local_238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeac,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(arithmetic-shift 255 -3)","");
  compile_fixture::run(&local_258,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("31",&local_258,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xead,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10 3)","");
  compile_fixture::run(&local_278,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeaf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10 3)","");
  compile_fixture::run(&local_298,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10.0 3)","");
  compile_fixture::run(&local_2b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10.0 3)","");
  compile_fixture::run(&local_2d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_2d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10.0 3.0)","");
  compile_fixture::run(&local_2f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_2f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10.0 3.0)","");
  compile_fixture::run(&local_318,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_318,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10 3.0)","");
  compile_fixture::run(&local_338,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_338,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10 3.0)","");
  compile_fixture::run(&local_358,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_358,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10 3)","");
  compile_fixture::run(&local_378,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_378,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10 3)","");
  compile_fixture::run(&local_398,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_398,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeb9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10.0 3)","");
  compile_fixture::run(&local_3b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_3b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeba,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10.0 3)","");
  compile_fixture::run(&local_3d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_3d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10.0 3.0)","");
  compile_fixture::run(&local_3f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_3f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10.0 3.0)","");
  compile_fixture::run(&local_418,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_418,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10 3.0)","");
  compile_fixture::run(&local_438,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_438,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebe,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10 3.0)","");
  compile_fixture::run(&local_458,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_458,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xebf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,
             "(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )","");
  compile_fixture::run(&local_478,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,
             "(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )","");
  compile_fixture::run(&local_498,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_498,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != &local_498.field_2) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(let ([a 1324] [b -324.0]) (quotient a b ))","");
  compile_fixture::run(&local_4b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_4b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(let ([a 1324] [b -324.0]) (remainder a b ))","");
  compile_fixture::run(&local_4d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("28",&local_4d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,
             "(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))","");
  compile_fixture::run(&local_4f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1324",&local_4f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10 3)","");
  compile_fixture::run(&local_518,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_518,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10 3)","");
  compile_fixture::run(&local_538,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_538,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xec9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10.0 3)","");
  compile_fixture::run(&local_558,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_558,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeca,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10.0 -3)","");
  compile_fixture::run(&local_578,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_578,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10.0 3.0)","");
  compile_fixture::run(&local_598,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_598,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10.0 3.0)","");
  compile_fixture::run(&local_5b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_5b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10 -3.0)","");
  compile_fixture::run(&local_5d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_5d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xece,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10 3.0)","");
  compile_fixture::run(&local_5f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_5f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xecf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 3)","");
  compile_fixture::run(&local_618,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_618,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 3.2)","");
  compile_fixture::run(&local_638,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_638,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs -3)","");
  compile_fixture::run(&local_658,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_658,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs -3.2)","");
  compile_fixture::run(&local_678,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_678,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 0)","");
  compile_fixture::run(&local_698,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_698,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 0.0)","");
  compile_fixture::run(&local_6b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(flonum->fixnum 3.143)","")
  ;
  compile_fixture::run(&local_6d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_6d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(flonum->fixnum -3.143)","");
  compile_fixture::run(&local_6f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_6f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xed9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(fixnum->flonum 3)","");
  compile_fixture::run(&local_718,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_718,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(flonum? (fixnum->flonum 3))","");
  compile_fixture::run(&local_738,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_738,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_758,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_758,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xede,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_778,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_778,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xedf,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1.5)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_798,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1.5",&local_798,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 2.2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_7b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2.2",&local_7b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee1,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1.0 2.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_7d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_7d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_7f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("7.2",&local_7f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1 2.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_818,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_818,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1.0 2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_838,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_838,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,local_838.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1 2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_858,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_858,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_858._M_dataplus._M_p != &local_858.field_2) {
    operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(max 1 2 7 -3 -11 6 3)","")
  ;
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_878,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("7",&local_878,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._M_dataplus._M_p != &local_878.field_2) {
    operator_delete(local_878._M_dataplus._M_p,local_878.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1.0 2.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_898,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_898,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xee9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_898._M_dataplus._M_p != &local_898.field_2) {
    operator_delete(local_898._M_dataplus._M_p,local_898.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_8b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_8b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeea,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b8._M_dataplus._M_p != &local_8b8.field_2) {
    operator_delete(local_8b8._M_dataplus._M_p,local_8b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1 2.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_8d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_8d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeeb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1.0 2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_8f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_8f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeec,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,local_8f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1 2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_918,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_918,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeed,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(min 1 2 7 -3 -11 6 3)","")
  ;
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_938,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-11",&local_938,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeee,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p,local_938.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(arithmetic-shift 1 10)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_958,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1024",&local_958,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeef,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p,local_958.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(arithmetic-shift 255 -3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_978,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("31",&local_978,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef0,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_998,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_998,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef2,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p,local_998.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_9b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_9b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef3,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10.0 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_9d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_9d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef4,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p,local_9d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10.0 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_9f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_9f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef5,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p,local_9f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10.0 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_a18,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_a18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef6,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p,local_a18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10.0 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_a38,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_a38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef7,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient 10 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_a58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_a58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef8,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(quotient -10 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_a78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_a78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xef9,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._M_dataplus._M_p != &local_a78.field_2) {
    operator_delete(local_a78._M_dataplus._M_p,local_a78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_a98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_a98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefb,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a98._M_dataplus._M_p != &local_a98.field_2) {
    operator_delete(local_a98._M_dataplus._M_p,local_a98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_ab8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_ab8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefc,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab8._M_dataplus._M_p != &local_ab8.field_2) {
    operator_delete(local_ab8._M_dataplus._M_p,local_ab8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10.0 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_ad8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_ad8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefd,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad8._M_dataplus._M_p != &local_ad8.field_2) {
    operator_delete(local_ad8._M_dataplus._M_p,local_ad8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10.0 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_af8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_af8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xefe,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af8._M_dataplus._M_p != &local_af8.field_2) {
    operator_delete(local_af8._M_dataplus._M_p,local_af8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10.0 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_b18,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_b18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xeff,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p,local_b18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10.0 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_b38,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_b38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf00,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_dataplus._M_p != &local_b38.field_2) {
    operator_delete(local_b38._M_dataplus._M_p,local_b38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder 10 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_b58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_b58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf01,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b58._M_dataplus._M_p != &local_b58.field_2) {
    operator_delete(local_b58._M_dataplus._M_p,local_b58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(remainder -10 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_b78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_b78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf02,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b78._M_dataplus._M_p != &local_b78.field_2) {
    operator_delete(local_b78._M_dataplus._M_p,local_b78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,
             "(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_b98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_b98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf04,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
    operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,
             "(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_bb8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_bb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf05,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
    operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(let ([a 1324] [b -324.0]) (quotient a b ))","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_bd8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_bd8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf06,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8._M_dataplus._M_p != &local_bd8.field_2) {
    operator_delete(local_bd8._M_dataplus._M_p,local_bd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(let ([a 1324] [b -324.0]) (remainder a b ))","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_bf8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("28",&local_bf8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf07,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf8._M_dataplus._M_p != &local_bf8.field_2) {
    operator_delete(local_bf8._M_dataplus._M_p,local_bf8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,
             "(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_c18,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1324",&local_c18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf08,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c18._M_dataplus._M_p != &local_c18.field_2) {
    operator_delete(local_c18._M_dataplus._M_p,local_c18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_c38,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_c38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c38._M_dataplus._M_p != &local_c38.field_2) {
    operator_delete(local_c38._M_dataplus._M_p,local_c38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_c58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_c58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c58._M_dataplus._M_p != &local_c58.field_2) {
    operator_delete(local_c58._M_dataplus._M_p,local_c58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10.0 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_c78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_c78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c78._M_dataplus._M_p != &local_c78.field_2) {
    operator_delete(local_c78._M_dataplus._M_p,local_c78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10.0 -3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_c98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-1",&local_c98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c98._M_dataplus._M_p != &local_c98.field_2) {
    operator_delete(local_c98._M_dataplus._M_p,local_c98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10.0 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_cb8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("1",&local_cb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb8._M_dataplus._M_p != &local_cb8.field_2) {
    operator_delete(local_cb8._M_dataplus._M_p,local_cb8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10.0 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_cd8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_cd8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf0f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p,local_cd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo 10 -3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_cf8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_cf8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf10,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p,local_cf8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(modulo -10 3.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_d18,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_d18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf11,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p,local_d18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_d38,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_d38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf13,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p,local_d38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 3.2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_d58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_d58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf14,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d58._M_dataplus._M_p != &local_d58.field_2) {
    operator_delete(local_d58._M_dataplus._M_p,local_d58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs -3)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_d78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_d78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf15,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d78._M_dataplus._M_p != &local_d78.field_2) {
    operator_delete(local_d78._M_dataplus._M_p,local_d78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs -3.2)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_d98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3.2",&local_d98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf16,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d98._M_dataplus._M_p != &local_d98.field_2) {
    operator_delete(local_d98._M_dataplus._M_p,local_d98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_db8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_db8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf17,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db8._M_dataplus._M_p != &local_db8.field_2) {
    operator_delete(local_db8._M_dataplus._M_p,local_db8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(abs 0.0)","");
  uVar2 = (this->super_compile_fixture).field_0x25;
  (this->super_compile_fixture).field_0x25 = 0;
  (this->super_compile_fixture).field_0x20 = 1;
  compile_fixture::run(&local_dd8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  (this->super_compile_fixture).field_0x25 = uVar2;
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("0",&local_dd8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf18,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd8._M_dataplus._M_p != &local_dd8.field_2) {
    operator_delete(local_dd8._M_dataplus._M_p,local_dd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(inexact->exact 3.14)","");
  compile_fixture::run(&local_df8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_df8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
    operator_delete(local_df8._M_dataplus._M_p,local_df8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(inexact->exact 3)","");
  compile_fixture::run(&local_e18,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_e18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e18._M_dataplus._M_p != &local_e18.field_2) {
    operator_delete(local_e18._M_dataplus._M_p,local_e18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(exact->inexact 3.14)","");
  compile_fixture::run(&local_e38,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3.14",&local_e38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p,local_e38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(exact->inexact 3)","");
  compile_fixture::run(&local_e58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_e58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e58._M_dataplus._M_p != &local_e58.field_2) {
    operator_delete(local_e58._M_dataplus._M_p,local_e58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(flonum? (exact->inexact 3))","");
  compile_fixture::run(&local_e78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_e78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf1f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e78._M_dataplus._M_p != &local_e78.field_2) {
    operator_delete(local_e78._M_dataplus._M_p,local_e78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_12f8,"(inexact? (exact->inexact 3))","");
  compile_fixture::run(&local_e98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_e98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf20,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e98._M_dataplus._M_p != &local_e98.field_2) {
    operator_delete(local_e98._M_dataplus._M_p,local_e98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(finite? 3.14)","");
  compile_fixture::run(&local_eb8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_eb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf22,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb8._M_dataplus._M_p != &local_eb8.field_2) {
    operator_delete(local_eb8._M_dataplus._M_p,local_eb8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(finite? 2)","");
  compile_fixture::run(&local_ed8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ed8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf23,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed8._M_dataplus._M_p != &local_ed8.field_2) {
    operator_delete(local_ed8._M_dataplus._M_p,local_ed8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(finite? (/ 1.0 0.0))","");
  compile_fixture::run(&local_ef8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_ef8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf24,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef8._M_dataplus._M_p != &local_ef8.field_2) {
    operator_delete(local_ef8._M_dataplus._M_p,local_ef8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(finite? (/ 0.0 0.0))","");
  compile_fixture::run(&local_f18,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf25,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f18._M_dataplus._M_p != &local_f18.field_2) {
    operator_delete(local_f18._M_dataplus._M_p,local_f18.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(nan? 3.14)","");
  compile_fixture::run(&local_f38,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf27,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f38._M_dataplus._M_p != &local_f38.field_2) {
    operator_delete(local_f38._M_dataplus._M_p,local_f38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(nan? 2)","");
  compile_fixture::run(&local_f58,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf28,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f58._M_dataplus._M_p != &local_f58.field_2) {
    operator_delete(local_f58._M_dataplus._M_p,local_f58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(nan? (/ 1.0 0.0))","");
  compile_fixture::run(&local_f78,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_f78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf29,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
    operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(nan? (/ 0.0 0.0))","");
  compile_fixture::run(&local_f98,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_f98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
    operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(inf? 3.14)","");
  compile_fixture::run(&local_fb8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_fb8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb8._M_dataplus._M_p != &local_fb8.field_2) {
    operator_delete(local_fb8._M_dataplus._M_p,local_fb8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(inf? 2)","");
  compile_fixture::run(&local_fd8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_fd8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd8._M_dataplus._M_p != &local_fd8.field_2) {
    operator_delete(local_fd8._M_dataplus._M_p,local_fd8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(inf? (/ 1.0 0.0))","");
  compile_fixture::run(&local_ff8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_ff8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
    operator_delete(local_ff8._M_dataplus._M_p,local_ff8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(inf? (/ 0.0 0.0))","");
  compile_fixture::run(&local_1018,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1018,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf2f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
    operator_delete(local_1018._M_dataplus._M_p,local_1018.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(/ 0.0 0.0)","");
  compile_fixture::run(&local_1038,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-nan",&local_1038,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf34,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038._M_dataplus._M_p != &local_1038.field_2) {
    operator_delete(local_1038._M_dataplus._M_p,local_1038.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(integer? 3)","");
  compile_fixture::run(&local_1058,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1058,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf39,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
    operator_delete(local_1058._M_dataplus._M_p,local_1058.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(integer? 3.2)","");
  compile_fixture::run(&local_1078,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#f",&local_1078,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
    operator_delete(local_1078._M_dataplus._M_p,local_1078.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(integer? 3.0)","");
  compile_fixture::run(&local_1098,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("#t",&local_1098,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    operator_delete(local_1098._M_dataplus._M_p,local_1098.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling 3)","");
  compile_fixture::run(&local_10b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_10b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b8._M_dataplus._M_p != &local_10b8.field_2) {
    operator_delete(local_10b8._M_dataplus._M_p,local_10b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling 3.0)","");
  compile_fixture::run(&local_10d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_10d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
    operator_delete(local_10d8._M_dataplus._M_p,local_10d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling 3.0000000001)","")
  ;
  compile_fixture::run(&local_10f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("4",&local_10f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf3f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f8._M_dataplus._M_p != &local_10f8.field_2) {
    operator_delete(local_10f8._M_dataplus._M_p,local_10f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling 2.9)","");
  compile_fixture::run(&local_1118,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1118,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf40,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1118._M_dataplus._M_p != &local_1118.field_2) {
    operator_delete(local_1118._M_dataplus._M_p,local_1118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling -3)","");
  compile_fixture::run(&local_1138,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf41,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
    operator_delete(local_1138._M_dataplus._M_p,local_1138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling -3.1)","");
  compile_fixture::run(&local_1158,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf42,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1158._M_dataplus._M_p != &local_1158.field_2) {
    operator_delete(local_1158._M_dataplus._M_p,local_1158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling -2.9)","");
  compile_fixture::run(&local_1178,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_1178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf43,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1178._M_dataplus._M_p != &local_1178.field_2) {
    operator_delete(local_1178._M_dataplus._M_p,local_1178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling -2.5)","");
  compile_fixture::run(&local_1198,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_1198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf44,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
    operator_delete(local_1198._M_dataplus._M_p,local_1198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(ceiling -2.1)","");
  compile_fixture::run(&local_11b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-2",&local_11b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf45,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
    operator_delete(local_11b8._M_dataplus._M_p,local_11b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor 3)","");
  compile_fixture::run(&local_11d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_11d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf47,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11d8._M_dataplus._M_p != &local_11d8.field_2) {
    operator_delete(local_11d8._M_dataplus._M_p,local_11d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor 3.0)","");
  compile_fixture::run(&local_11f8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_11f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf48,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f8._M_dataplus._M_p != &local_11f8.field_2) {
    operator_delete(local_11f8._M_dataplus._M_p,local_11f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor 3.0000000001)","");
  compile_fixture::run(&local_1218,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("3",&local_1218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf49,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1218._M_dataplus._M_p != &local_1218.field_2) {
    operator_delete(local_1218._M_dataplus._M_p,local_1218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor 2.9)","");
  compile_fixture::run(&local_1238,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("2",&local_1238,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4a,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1238._M_dataplus._M_p != &local_1238.field_2) {
    operator_delete(local_1238._M_dataplus._M_p,local_1238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor -3)","");
  compile_fixture::run(&local_1258,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1258,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4b,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
    operator_delete(local_1258._M_dataplus._M_p,local_1258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor -3.1)","");
  compile_fixture::run(&local_1278,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-4",&local_1278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4c,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
    operator_delete(local_1278._M_dataplus._M_p,local_1278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor -2.9)","");
  compile_fixture::run(&local_1298,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_1298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4d,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
    operator_delete(local_1298._M_dataplus._M_p,local_1298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor -2.5)","");
  compile_fixture::run(&local_12b8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  iVar3 = 0x1fe314;
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_12b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4e,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
    operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  local_12f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"(floor -2.1)","");
  compile_fixture::run(&local_12d8,&this->super_compile_fixture,&local_12f8,true,iVar3);
  TestEq<char_const*,std::__cxx11::string>
            ("-3",&local_12d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi.tests/compile_tests.cpp"
             ,0xf4f,"void skiwi::(anonymous namespace)::minmax_test::test()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
    operator_delete(local_12d8._M_dataplus._M_p,local_12d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test()
      {
      build_libs();

      TEST_EQ("1", run("(max 1)"));
      TEST_EQ("2", run("(min 2)"));
      TEST_EQ("1.5", run("(max 1.5)"));
      TEST_EQ("2.2", run("(min 2.2)"));
      TEST_EQ("2", run("(max 1.0 2.0)"));
      TEST_EQ("7.2", run("(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("2", run("(max 1 2.0)"));
      TEST_EQ("2", run("(max 1.0 2)"));
      TEST_EQ("2", run("(max 1 2)"));
      TEST_EQ("7", run("(max 1 2 7 -3 -11 6 3)"));

      TEST_EQ("1", run("(min 1.0 2.0)"));
      TEST_EQ("-11", run("(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("1", run("(min 1 2.0)"));
      TEST_EQ("1", run("(min 1.0 2)"));
      TEST_EQ("1", run("(min 1 2)"));
      TEST_EQ("-11", run("(min 1 2 7 -3 -11 6 3)"));
      TEST_EQ("1024", run("(arithmetic-shift 1 10)"));
      TEST_EQ("31", run("(arithmetic-shift 255 -3)"));

      TEST_EQ("3", run("(quotient 10 3)"));
      TEST_EQ("-3", run("(quotient -10 3)"));
      TEST_EQ("3", run("(quotient 10.0 3)"));
      TEST_EQ("-3", run("(quotient -10.0 3)"));
      TEST_EQ("3", run("(quotient 10.0 3.0)"));
      TEST_EQ("-3", run("(quotient -10.0 3.0)"));
      TEST_EQ("3", run("(quotient 10 3.0)"));
      TEST_EQ("-3", run("(quotient -10 3.0)"));

      TEST_EQ("1", run("(remainder 10 3)"));
      TEST_EQ("-1", run("(remainder -10 3)"));
      TEST_EQ("1", run("(remainder 10.0 3)"));
      TEST_EQ("-1", run("(remainder -10.0 3)"));
      TEST_EQ("1", run("(remainder 10.0 3.0)"));
      TEST_EQ("-1", run("(remainder -10.0 3.0)"));
      TEST_EQ("1", run("(remainder 10 3.0)"));
      TEST_EQ("-1", run("(remainder -10 3.0)"));


      TEST_EQ("#t", run("(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("#t", run("(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("-4", run("(let ([a 1324] [b -324.0]) (quotient a b ))"));
      TEST_EQ("28", run("(let ([a 1324] [b -324.0]) (remainder a b ))"));
      TEST_EQ("1324", run("(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))"));

      TEST_EQ("1", run("(modulo 10 3)"));
      TEST_EQ("2", run("(modulo -10 3)"));
      TEST_EQ("1", run("(modulo 10.0 3)"));
      TEST_EQ("-1", run("(modulo -10.0 -3)"));
      TEST_EQ("1", run("(modulo 10.0 3.0)"));
      TEST_EQ("2", run("(modulo -10.0 3.0)"));
      TEST_EQ("-2", run("(modulo 10 -3.0)"));
      TEST_EQ("2", run("(modulo -10 3.0)"));

      TEST_EQ("3", run("(abs 3)"));
      TEST_EQ("3.2", run("(abs 3.2)"));
      TEST_EQ("3", run("(abs -3)"));
      TEST_EQ("3.2", run("(abs -3.2)"));
      TEST_EQ("0", run("(abs 0)"));
      TEST_EQ("0", run("(abs 0.0)"));

      TEST_EQ("3", run("(flonum->fixnum 3.143)"));
      TEST_EQ("-3", run("(flonum->fixnum -3.143)"));

      TEST_EQ("3", run("(fixnum->flonum 3)"));
      TEST_EQ("#t", run("(flonum? (fixnum->flonum 3))"));

      TEST_EQ("1", run_optimized("(max 1)"));
      TEST_EQ("2", run_optimized("(min 2)"));
      TEST_EQ("1.5", run_optimized("(max 1.5)"));
      TEST_EQ("2.2", run_optimized("(min 2.2)"));
      TEST_EQ("2", run_optimized("(max 1.0 2.0)"));
      TEST_EQ("7.2", run_optimized("(max 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("2", run_optimized("(max 1 2.0)"));
      TEST_EQ("2", run_optimized("(max 1.0 2)"));
      TEST_EQ("2", run_optimized("(max 1 2)"));
      TEST_EQ("7", run_optimized("(max 1 2 7 -3 -11 6 3)"));

      TEST_EQ("1", run_optimized("(min 1.0 2.0)"));
      TEST_EQ("-11", run_optimized("(min 1.0 2.0 -0.4 7.2 2.3 7.1 -11.0)"));
      TEST_EQ("1", run_optimized("(min 1 2.0)"));
      TEST_EQ("1", run_optimized("(min 1.0 2)"));
      TEST_EQ("1", run_optimized("(min 1 2)"));
      TEST_EQ("-11", run_optimized("(min 1 2 7 -3 -11 6 3)"));
      TEST_EQ("1024", run_optimized("(arithmetic-shift 1 10)"));
      TEST_EQ("31", run_optimized("(arithmetic-shift 255 -3)"));

      TEST_EQ("3", run_optimized("(quotient 10 3)"));
      TEST_EQ("-3", run_optimized("(quotient -10 3)"));
      TEST_EQ("3", run_optimized("(quotient 10.0 3)"));
      TEST_EQ("-3", run_optimized("(quotient -10.0 3)"));
      TEST_EQ("3", run_optimized("(quotient 10.0 3.0)"));
      TEST_EQ("-3", run_optimized("(quotient -10.0 3.0)"));
      TEST_EQ("3", run_optimized("(quotient 10 3.0)"));
      TEST_EQ("-3", run_optimized("(quotient -10 3.0)"));

      TEST_EQ("1", run_optimized("(remainder 10 3)"));
      TEST_EQ("-1", run_optimized("(remainder -10 3)"));
      TEST_EQ("1", run_optimized("(remainder 10.0 3)"));
      TEST_EQ("-1", run_optimized("(remainder -10.0 3)"));
      TEST_EQ("1", run_optimized("(remainder 10.0 3.0)"));
      TEST_EQ("-1", run_optimized("(remainder -10.0 3.0)"));
      TEST_EQ("1", run_optimized("(remainder 10 3.0)"));
      TEST_EQ("-1", run_optimized("(remainder -10 3.0)"));

      TEST_EQ("#t", run_optimized("(let ([a 1324] [b 324]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("#t", run_optimized("(let ([a 1324] [b -324.0]) (= (+ (* (quotient a b) b)  (remainder a b) )  a)  )"));
      TEST_EQ("-4", run_optimized("(let ([a 1324] [b -324.0]) (quotient a b ))"));
      TEST_EQ("28", run_optimized("(let ([a 1324] [b -324.0]) (remainder a b ))"));
      TEST_EQ("1324", run_optimized("(let ([a 1324] [b -324.0]) (+ (* (quotient a b) b)  (remainder a b) ))"));

      TEST_EQ("1", run_optimized("(modulo 10 3)"));
      TEST_EQ("2", run_optimized("(modulo -10 3)"));
      TEST_EQ("1", run_optimized("(modulo 10.0 3)"));
      TEST_EQ("-1", run_optimized("(modulo -10.0 -3)"));
      TEST_EQ("1", run_optimized("(modulo 10.0 3.0)"));
      TEST_EQ("2", run_optimized("(modulo -10.0 3.0)"));
      TEST_EQ("-2", run_optimized("(modulo 10 -3.0)"));
      TEST_EQ("2", run_optimized("(modulo -10 3.0)"));

      TEST_EQ("3", run_optimized("(abs 3)"));
      TEST_EQ("3.2", run_optimized("(abs 3.2)"));
      TEST_EQ("3", run_optimized("(abs -3)"));
      TEST_EQ("3.2", run_optimized("(abs -3.2)"));
      TEST_EQ("0", run_optimized("(abs 0)"));
      TEST_EQ("0", run_optimized("(abs 0.0)"));

      TEST_EQ("3", run("(inexact->exact 3.14)"));
      TEST_EQ("3", run("(inexact->exact 3)"));

      TEST_EQ("3.14", run("(exact->inexact 3.14)"));
      TEST_EQ("3", run("(exact->inexact 3)"));
      TEST_EQ("#t", run("(flonum? (exact->inexact 3))"));
      TEST_EQ("#t", run("(inexact? (exact->inexact 3))"));

      TEST_EQ("#t", run("(finite? 3.14)"));
      TEST_EQ("#t", run("(finite? 2)"));
      TEST_EQ("#f", run("(finite? (/ 1.0 0.0))"));
      TEST_EQ("#f", run("(finite? (/ 0.0 0.0))"));

      TEST_EQ("#f", run("(nan? 3.14)"));
      TEST_EQ("#f", run("(nan? 2)"));
      TEST_EQ("#f", run("(nan? (/ 1.0 0.0))"));
      TEST_EQ("#t", run("(nan? (/ 0.0 0.0))"));

      TEST_EQ("#f", run("(inf? 3.14)"));
      TEST_EQ("#f", run("(inf? 2)"));
      TEST_EQ("#t", run("(inf? (/ 1.0 0.0))"));
      TEST_EQ("#f", run("(inf? (/ 0.0 0.0))"));

#ifdef _WIN32
      TEST_EQ("-nan(ind)", run("(/ 0.0 0.0)"));
#elif defined(unix)
      TEST_EQ("-nan", run("(/ 0.0 0.0)"));
#else
      TEST_EQ("nan", run("(/ 0.0 0.0)"));
#endif

      TEST_EQ("#t", run("(integer? 3)"));
      TEST_EQ("#f", run("(integer? 3.2)"));
      TEST_EQ("#t", run("(integer? 3.0)"));

      TEST_EQ("3", run("(ceiling 3)"));
      TEST_EQ("3", run("(ceiling 3.0)"));
      TEST_EQ("4", run("(ceiling 3.0000000001)"));
      TEST_EQ("3", run("(ceiling 2.9)"));
      TEST_EQ("-3", run("(ceiling -3)"));
      TEST_EQ("-3", run("(ceiling -3.1)"));
      TEST_EQ("-2", run("(ceiling -2.9)"));
      TEST_EQ("-2", run("(ceiling -2.5)"));
      TEST_EQ("-2", run("(ceiling -2.1)"));

      TEST_EQ("3", run("(floor 3)"));
      TEST_EQ("3", run("(floor 3.0)"));
      TEST_EQ("3", run("(floor 3.0000000001)"));
      TEST_EQ("2", run("(floor 2.9)"));
      TEST_EQ("-3", run("(floor -3)"));
      TEST_EQ("-4", run("(floor -3.1)"));
      TEST_EQ("-3", run("(floor -2.9)"));
      TEST_EQ("-3", run("(floor -2.5)"));
      TEST_EQ("-3", run("(floor -2.1)"));
      }